

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefEnum
          (ExtensionSet *this,int number,int *default_value)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar1;
  CppType *v1_00;
  CppType *v2_00;
  undefined1 auVar2 [16];
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  CppType local_88;
  CppType local_84;
  string *local_80;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  anon_enum_32 local_40;
  anon_enum_32 local_3c;
  string *local_38;
  string *absl_log_internal_check_op_result;
  Extension *extension;
  int *default_value_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)default_value;
  default_value_local._4_4_ = number;
  pEStack_18 = this;
  absl_log_internal_check_op_result = (string *)FindOrNull(this,number);
  if ((absl_log_internal_check_op_result == (string *)0x0) ||
     ((*(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) >> 1 & 1) != 0)) {
    this_local = (ExtensionSet *)extension;
  }
  else {
    local_3c = (anon_enum_32)((absl_log_internal_check_op_result->_M_string_length & 0x100) == 0);
    v1 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_3c);
    local_40 = OPTIONAL_FIELD;
    v2 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_40);
    local_38 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_38 != (string *)0x0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x1e2,local_68._0_8_,local_68._8_8_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
    }
    local_84 = anon_unknown_58::cpp_type
                         ((FieldType)absl_log_internal_check_op_result->_M_string_length);
    v1_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_84);
    local_88 = CPPTYPE_ENUM;
    v2_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_88);
    local_80 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM")
    ;
    if (local_80 != (string *)0x0) {
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x1e2,auVar2._0_8_,auVar2._8_8_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
    }
    this_local = (ExtensionSet *)absl_log_internal_check_op_result;
  }
  return (int *)this_local;
}

Assistant:

const int& ExtensionSet::GetRefEnum(int number,
                                    const int& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}